

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_field_value_clone(amqp_field_value_t *original,amqp_field_value_t *clone,amqp_pool_t *pool)

{
  anon_union_16_15_ecedea02_for_value *output;
  uint8_t uVar1;
  size_t amount;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = original->kind;
  clone->kind = uVar1;
  iVar2 = -10;
  switch(uVar1) {
  case 'A':
    if ((original->value).bytes.bytes == (void *)0x0) {
      (clone->value).i64 = 0;
      (clone->value).array.entries = (amqp_field_value_t_ *)0x0;
    }
    else {
      iVar2 = (original->value).boolean;
      (clone->value).boolean = iVar2;
      pvVar3 = amqp_pool_alloc(pool,(long)iVar2 * 0x18);
      (clone->value).bytes.bytes = pvVar3;
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      lVar5 = -1;
      lVar4 = 0;
      while (lVar5 = lVar5 + 1, lVar5 < (clone->value).boolean) {
        iVar2 = amqp_field_value_clone
                          ((amqp_field_value_t *)((long)(original->value).bytes.bytes + lVar4),
                           (amqp_field_value_t *)(lVar4 + (long)(clone->value).bytes.bytes),pool);
        lVar4 = lVar4 + 0x18;
        if (iVar2 != 0) {
          return iVar2;
        }
      }
    }
    break;
  case 'B':
switchD_0010a396_caseD_62:
    (clone->value).i8 = (original->value).i8;
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010a396_caseD_63;
  case 'D':
  case 'L':
  case 'T':
switchD_0010a396_caseD_6c:
    (clone->value).i64 = (original->value).i64;
    break;
  case 'F':
    iVar2 = amqp_table_clone(&(original->value).table,&(clone->value).table,pool);
    return iVar2;
  case 'I':
switchD_0010a396_caseD_69:
    (clone->value).boolean = (original->value).boolean;
    break;
  case 'S':
switchD_0010a3b4_caseD_53:
    amount = (original->value).bytes.len;
    output = &clone->value;
    if (amount == 0) {
      (output->bytes).len = 0;
      (clone->value).bytes.bytes = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes(pool,amount,&output->bytes);
      pvVar3 = (clone->value).bytes.bytes;
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      memcpy(pvVar3,(original->value).bytes.bytes,(output->bytes).len);
    }
    break;
  case 'V':
    break;
  default:
    switch(uVar1) {
    case 'b':
      goto switchD_0010a396_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010a396_caseD_63;
    case 'd':
      (clone->value).i64 = (original->value).i64;
      break;
    case 'f':
      (clone->value).boolean = (original->value).boolean;
      break;
    case 'i':
    case 't':
      goto switchD_0010a396_caseD_69;
    case 'l':
      goto switchD_0010a396_caseD_6c;
    case 's':
    case 'u':
      (clone->value).i16 = (original->value).i16;
      break;
    default:
      if (uVar1 != 'x') {
        return -10;
      }
      goto switchD_0010a3b4_caseD_53;
    }
  }
  iVar2 = 0;
switchD_0010a396_caseD_63:
  return iVar2;
}

Assistant:

static int amqp_field_value_clone(const amqp_field_value_t *original,
                                  amqp_field_value_t *clone,
                                  amqp_pool_t *pool) {
  int i;
  int res;
  clone->kind = original->kind;

  switch (clone->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      clone->value.boolean = original->value.boolean;
      break;

    case AMQP_FIELD_KIND_I8:
      clone->value.i8 = original->value.i8;
      break;

    case AMQP_FIELD_KIND_U8:
      clone->value.u8 = original->value.u8;
      break;

    case AMQP_FIELD_KIND_I16:
      clone->value.i16 = original->value.i16;
      break;

    case AMQP_FIELD_KIND_U16:
      clone->value.u16 = original->value.u16;
      break;

    case AMQP_FIELD_KIND_I32:
      clone->value.i32 = original->value.i32;
      break;

    case AMQP_FIELD_KIND_U32:
      clone->value.u32 = original->value.u32;
      break;

    case AMQP_FIELD_KIND_I64:
      clone->value.i64 = original->value.i64;
      break;

    case AMQP_FIELD_KIND_U64:
    case AMQP_FIELD_KIND_TIMESTAMP:
      clone->value.u64 = original->value.u64;
      break;

    case AMQP_FIELD_KIND_F32:
      clone->value.f32 = original->value.f32;
      break;

    case AMQP_FIELD_KIND_F64:
      clone->value.f64 = original->value.f64;
      break;

    case AMQP_FIELD_KIND_DECIMAL:
      clone->value.decimal = original->value.decimal;
      break;

    case AMQP_FIELD_KIND_UTF8:
    case AMQP_FIELD_KIND_BYTES:
      if (0 == original->value.bytes.len) {
        clone->value.bytes = amqp_empty_bytes;
      } else {
        amqp_pool_alloc_bytes(pool, original->value.bytes.len,
                              &clone->value.bytes);
        if (NULL == clone->value.bytes.bytes) {
          return AMQP_STATUS_NO_MEMORY;
        }
        memcpy(clone->value.bytes.bytes, original->value.bytes.bytes,
               clone->value.bytes.len);
      }
      break;

    case AMQP_FIELD_KIND_ARRAY:
      if (0 == original->value.array.entries) {
        clone->value.array = amqp_empty_array;
      } else {
        clone->value.array.num_entries = original->value.array.num_entries;
        clone->value.array.entries = amqp_pool_alloc(
            pool, clone->value.array.num_entries * sizeof(amqp_field_value_t));
        if (NULL == clone->value.array.entries) {
          return AMQP_STATUS_NO_MEMORY;
        }

        for (i = 0; i < clone->value.array.num_entries; ++i) {
          res = amqp_field_value_clone(&original->value.array.entries[i],
                                       &clone->value.array.entries[i], pool);
          if (AMQP_STATUS_OK != res) {
            return res;
          }
        }
      }
      break;

    case AMQP_FIELD_KIND_TABLE:
      return amqp_table_clone(&original->value.table, &clone->value.table,
                              pool);

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
  }

  return AMQP_STATUS_OK;
}